

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

ctmbstr HTMLVersion(TidyDocImpl *doc)

{
  uint local_2c;
  ctmbstr local_28;
  ctmbstr result;
  uint version;
  uint declared;
  uint versionEmitted;
  TidyDocImpl *doc_local;
  
  local_2c = doc->lexer->versionEmitted;
  if (local_2c == 0) {
    local_2c = doc->lexer->doctype;
  }
  local_28 = prvTidyHTMLVersionNameFromCode(local_2c,no);
  if (local_28 == (ctmbstr)0x0) {
    local_28 = tidyLocalizedString(0x1fb);
  }
  return local_28;
}

Assistant:

static ctmbstr HTMLVersion( TidyDocImpl* doc )
{
    uint versionEmitted = doc->lexer->versionEmitted;
    uint declared = doc->lexer->doctype;
    uint version = versionEmitted == 0 ? declared : versionEmitted;
    ctmbstr result = TY_(HTMLVersionNameFromCode)(version, 0);
    if (!result)
        result = tidyLocalizedString(STRING_HTML_PROPRIETARY);
    return result;
}